

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int32_t ofs;
  int *piVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  undefined8 extraout_RDX;
  char *pcVar7;
  uint uVar8;
  char **unaff_RBX;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char cVar12;
  char *pcVar13;
  int i;
  long lVar14;
  char **ppcVar15;
  char **unaff_R14;
  int i_1;
  char acStack_ba0 [208];
  undefined8 uStack_ad0;
  ulong uStack_ac8;
  ulong uStack_ac0;
  ulong uStack_ab8;
  ulong uStack_ab0;
  char *pcStack_aa8;
  ulong uStack_aa0;
  FILE *pFStack_a98;
  BuildCtx *pBStack_a90;
  uint local_a84;
  BuildCtx ctx_;
  char buf [80];
  
  ctx_.mode = ~BUILD_elfasm;
  ctx_.outname = "-";
  pcVar7 = argv[1];
  pcVar13 = (char *)argv;
  if (pcVar7 == (char *)0x0) {
LAB_00107338:
    pBStack_a90 = (BuildCtx *)0x10733d;
    usage();
LAB_0010733d:
    pBStack_a90 = (BuildCtx *)0x107345;
    main_cold_3();
  }
  else {
    iVar10 = 1;
    lVar14 = 0xffffffff;
    while (iVar4 = (int)lVar14, unaff_R14 = argv, *pcVar7 == '-') {
      bVar1 = pcVar7[1];
      if (bVar1 < 0x6f) {
        if (bVar1 != 0x6d) {
          if (bVar1 != 0) {
            if ((bVar1 != 0x2d) || (pcVar7[2] != '\0')) goto LAB_00107338;
            iVar10 = iVar10 + 1;
          }
          break;
        }
        if ((pcVar7[2] != '\0') || (pcVar7 = argv[iVar10 + 1], pcVar7 == (char *)0x0))
        goto LAB_00107338;
        unaff_RBX = modenames;
        lVar14 = 0;
        while( true ) {
          pcVar13 = *unaff_RBX;
          pBStack_a90 = (BuildCtx *)0x1068cd;
          iVar4 = strcmp(pcVar7,pcVar13);
          if (iVar4 == 0) break;
          lVar14 = lVar14 + 1;
          unaff_RBX = &((FILE *)unaff_RBX)->_IO_read_ptr;
          if (lVar14 == 0xb) goto LAB_00107338;
        }
        ctx_.mode = (BuildMode)lVar14;
        pcVar7 = ctx_.outname;
      }
      else if (((bVar1 != 0x6f) || (pcVar7[2] != '\0')) ||
              (pcVar7 = argv[iVar10 + 1], argv[iVar10 + 1] == (char *)0x0)) goto LAB_00107338;
      ctx_.outname = pcVar7;
      iVar4 = (int)lVar14;
      iVar9 = iVar10 + 1;
      iVar10 = iVar10 + 2;
      pcVar7 = argv[(long)iVar9 + 1];
      if (pcVar7 == (char *)0x0) break;
    }
    ctx_.args = argv + iVar10;
    if (iVar4 == -1) goto LAB_00107338;
    ctx_.nglob = 0x9e;
    lVar14 = 1;
    pBStack_a90 = (BuildCtx *)0x10697a;
    ctx_.glob = (void **)calloc(1,0x4f0);
    ctx_.nreloc = 0;
    ppcVar15 = globnames;
    ctx_.globnames = globnames;
    ctx_.extnames = extnames;
    pBStack_a90 = (BuildCtx *)0x1069a7;
    ctx_.relocsym = (char **)malloc(0x1d0);
    ctx_.nrelocsym = 0;
    pBStack_a90 = (BuildCtx *)0x1069c5;
    memset(relocmap,0xff,0xe8);
    ctx_.dasm_ident = "DynASM 1.4.0";
    ctx_.dasm_arch = "x86";
    pBStack_a90 = (BuildCtx *)0x1069ee;
    dasm_init(&ctx_,2);
    pBStack_a90 = (BuildCtx *)0x1069fe;
    dasm_setupglobal(&ctx_,ctx_.glob,ctx_.nglob);
    pBStack_a90 = (BuildCtx *)0x106a0d;
    dasm_setup(&ctx_,build_actionlist);
    pBStack_a90 = (BuildCtx *)0x106a15;
    build_backend(&ctx_);
    ctx_.npc = 0x61;
    if ((ctx_.D)->status == 0) {
      piVar3 = (ctx_.D)->lglabels;
      do {
        if (0 < piVar3[lVar14]) {
          (ctx_.D)->status = (uint)lVar14 | 0x21000000;
          break;
        }
        piVar3[lVar14] = 0;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 10);
    }
    pBStack_a90 = (BuildCtx *)0x106a5d;
    uVar5 = dasm_link(&ctx_,&ctx_.codesz);
    if (uVar5 != 0) {
LAB_00106dac:
      pBStack_a90 = (BuildCtx *)0x106dc7;
      fprintf(_stderr,"Error: DASM error %08x\n",(ulong)uVar5);
      return 1;
    }
    pBStack_a90 = (BuildCtx *)0x106a73;
    ctx_.code = (uint8_t *)malloc(CONCAT44(ctx_.codesz._4_4_,(int32_t)ctx_.codesz));
    pBStack_a90 = (BuildCtx *)0x106a82;
    uVar5 = dasm_encode(&ctx_,ctx_.code);
    if (uVar5 != 0) goto LAB_00106dac;
    pBStack_a90 = (BuildCtx *)0x106aa1;
    ctx_.beginsym = sym_decorate((BuildCtx *)(ulong)ctx_.mode,"","lj_vm_asm_begin");
    iVar10 = ctx_.nglob;
    unaff_RBX = (char **)(long)ctx_.npc;
    pBStack_a90 = (BuildCtx *)0x106ac0;
    ctx_.sym = (BuildSym *)malloc((long)(ctx_.npc + ctx_.nglob + 1) << 4);
    ctx_.nsym = 0;
    pBStack_a90 = (BuildCtx *)0x106ada;
    ctx_.bc_ofs = (int32_t *)malloc((long)unaff_RBX * 4);
    if (0 < (long)unaff_RBX) {
      unaff_RBX = bc_names;
      uVar11 = 0;
      lVar14 = 0;
      do {
        if ((((ctx_.D)->pcsize <= uVar11) || (-1 < (ctx_.D)->pclabels[lVar14])) ||
           (uVar5 = -(ctx_.D)->pclabels[lVar14], ofs = (ctx_.D)->sections[uVar5 >> 0x18].rbuf[uVar5]
           , ofs < 0)) {
          uVar5 = (uint)lVar14 | 0x22000000;
          goto LAB_00106dac;
        }
        ctx_.bc_ofs[lVar14] = ofs;
        pBStack_a90 = (BuildCtx *)0x106b51;
        sym_insert(&ctx_,ofs,"lj_BC_",*unaff_RBX);
        lVar14 = lVar14 + 1;
        unaff_RBX = unaff_RBX + 1;
        uVar11 = uVar11 + 4;
        iVar10 = ctx_.nglob;
      } while (lVar14 < ctx_.npc);
    }
    if (0 < iVar10) {
      unaff_RBX = (char **)0x0;
      do {
        pcVar7 = *ppcVar15;
        pBStack_a90 = (BuildCtx *)0x106b88;
        sVar6 = strlen(pcVar7);
        pcVar13 = (char *)ctx_.glob[(long)unaff_RBX];
        unaff_R14 = (char **)"lj_";
        if ((char **)pcVar13 == (char **)0x0) goto LAB_0010733d;
        iVar4 = (int)sVar6;
        if (((iVar4 < 2) || (pcVar7[iVar4 - 2] != '_')) || (pcVar7[iVar4 - 1] != 'Z')) {
          pBStack_a90 = (BuildCtx *)0x106bcf;
          sym_insert(&ctx_,(int)pcVar13 - (int)ctx_.code,"lj_",pcVar7);
          iVar10 = ctx_.nglob;
        }
        unaff_RBX = (char **)((long)&((FILE *)unaff_RBX)->_flags + 1);
        ppcVar15 = ppcVar15 + 1;
      } while ((long)unaff_RBX < (long)iVar10);
    }
    unaff_R14 = (char **)&ctx_;
    pBStack_a90 = (BuildCtx *)0x106bfd;
    sym_insert((BuildCtx *)unaff_R14,(int32_t)ctx_.codesz,"","");
    ctx_.nsym = ctx_.nsym + -1;
    pBStack_a90 = (BuildCtx *)0x106c09;
    dasm_free((BuildCtx *)unaff_R14);
    pcVar13 = "w";
    if (ctx_.mode - BUILD_peobj < 2) {
      pcVar13 = "wb";
    }
    if ((*ctx_.outname == '-') && (ctx_.outname[1] == '\0')) {
      ctx_.fp = _stdout;
    }
    else {
      pBStack_a90 = (BuildCtx *)0x106c3d;
      ctx_.fp = (FILE *)fopen64(ctx_.outname,pcVar13);
      if ((FILE *)ctx_.fp == (FILE *)0x0) goto LAB_0010734a;
    }
    switch(ctx_.mode) {
    case BUILD_elfasm:
    case BUILD_coffasm:
    case BUILD_machasm:
      pBStack_a90 = (BuildCtx *)0x106c77;
      emit_asm(&ctx_);
      if (ctx_.mode == BUILD_machasm) {
        pBStack_a90 = (BuildCtx *)0x106dec;
        fwrite("\t.section __TEXT,__eh_frame,coalesced,no_toc+strip_static_syms+live_support\n",0x4c
               ,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106e07;
        fwrite("EH_frame1:\n\t.set L$set$x,LECIEX-LSCIEX\n\t.long L$set$x\nLSCIEX:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zPR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 6\n\t.byte 0x9b\n\t.long _lj_err_unwind_dwarf+4@GOTPCREL\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEX:\n\n"
               ,0x11c,1,(FILE *)ctx_.fp);
        if (0 < ctx_.nsym) {
          lVar14 = 0;
          uVar11 = 0;
          local_a84 = 0;
          iVar10 = ctx_.nsym;
          do {
            uVar8 = *(int *)((long)&ctx_.sym[1].ofs + lVar14) -
                    *(int *)((long)&(ctx_.sym)->ofs + lVar14);
            uVar5 = local_a84;
            if (uVar8 != 0) {
              pcVar7 = *(char **)((long)&(ctx_.sym)->name + lVar14);
              pBStack_a90 = (BuildCtx *)0x106e47;
              iVar4 = strcmp(pcVar7,"_lj_vm_ffi_call");
              uVar5 = uVar8;
              if (iVar4 != 0) {
                pFStack_a98 = (FILE *)0x60;
                uStack_ad0 = 0x106e79;
                uStack_ac8 = uVar11;
                uStack_ac0 = uVar11;
                uStack_ab8 = uVar11;
                uStack_ab0 = uVar11;
                pcStack_aa8 = pcVar7;
                uStack_aa0 = (ulong)uVar8;
                pBStack_a90 = (BuildCtx *)uVar11;
                fprintf((FILE *)ctx_.fp,
                        "%s.eh:\nLSFDE%d:\n\t.set L$set$%d,LEFDE%d-LASFDE%d\n\t.long L$set$%d\nLASFDE%d:\n\t.long LASFDE%d-EH_frame1\n\t.long %s-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte %d\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0x83\n\t.byte 0x3\n\t.byte 0x8f\n\t.byte 0x4\n\t.byte 0x8e\n\t.byte 0x5\n\t.align 3\nLEFDE%d:\n\n"
                        ,pcVar7,uVar11 & 0xffffffff,uVar11 & 0xffffffff,uVar11 & 0xffffffff);
                iVar10 = ctx_.nsym;
                uVar5 = local_a84;
              }
            }
            local_a84 = uVar5;
            uVar5 = local_a84;
            uVar11 = uVar11 + 1;
            lVar14 = lVar14 + 0x10;
          } while ((long)uVar11 < (long)iVar10);
          unaff_R14 = (char **)"_lj_vm_ffi_call";
          if (local_a84 != 0) {
            pBStack_a90 = (BuildCtx *)0x106eba;
            fwrite("EH_frame2:\n\t.set L$set$y,LECIEY-LSCIEY\n\t.long L$set$y\nLSCIEY:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEY:\n\n"
                   ,0xe8,1,(FILE *)ctx_.fp);
            pBStack_a90 = (BuildCtx *)0x106ecf;
            fprintf((FILE *)ctx_.fp,
                    "_lj_vm_ffi_call.eh:\nLSFDEY:\n\t.set L$set$yy,LEFDEY-LASFDEY\n\t.long L$set$yy\nLASFDEY:\n\t.long LASFDEY-EH_frame2\n\t.long _lj_vm_ffi_call-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte 16\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0xd\n\t.byte 0x6\n\t.byte 0x83\n\t.byte 0x3\n\t.align 3\nLEFDEY:\n\n"
                    ,(ulong)uVar5);
          }
        }
        pcVar7 = ".subsections_via_symbols\n";
        pcVar13 = (char *)0x19;
        goto LAB_0010722c;
      }
      if (ctx_.mode == BUILD_elfasm) {
        uVar5 = *(int *)(ctx_.glob + 0x9a) - (int)ctx_.code;
        pBStack_a90 = (BuildCtx *)0x106cb5;
        fwrite("\t.section .debug_frame,\"\",@progbits\n",0x24,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106cd0;
        fwrite(".Lframe0:\n\t.long .LECIE0-.LSCIE0\n.LSCIE0:\n\t.long 0xffffffff\n\t.byte 0x1\n\t.string \"\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE0:\n\n"
               ,0xd2,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106cea;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE0:\n\t.long .LEFDE0-.LASFDE0\n.LASFDE0:\n\t.long .Lframe0\n\t.quad .Lbegin\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE0:\n\n"
                ,(ulong)uVar5,0x60);
        pBStack_a90 = (BuildCtx *)0x106d03;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE1:\n\t.long .LEFDE1-.LASFDE1\n.LASFDE1:\n\t.long .Lframe0\n\t.quad lj_vm_ffi_call\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE1:\n\n"
                ,(ulong)((int32_t)ctx_.codesz - uVar5));
        pBStack_a90 = (BuildCtx *)0x106d1e;
        fwrite("\t.section .eh_frame,\"a\",@progbits\n",0x22,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106d39;
        fwrite(".Lframe1:\n\t.long .LECIE1-.LSCIE1\n.LSCIE1:\n\t.long 0\n\t.byte 0x1\n\t.string \"zPR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 6\n\t.byte 0x1b\n\t.long lj_err_unwind_dwarf-.\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE1:\n\n"
               ,0x10d,1,(FILE *)ctx_.fp);
        pBStack_a90 = (BuildCtx *)0x106d53;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE2:\n\t.long .LEFDE2-.LASFDE2\n.LASFDE2:\n\t.long .LASFDE2-.Lframe1\n\t.long .Lbegin-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE2:\n\n"
                ,(ulong)uVar5,0x60);
        pBStack_a90 = (BuildCtx *)0x106d6e;
        fwrite(".Lframe2:\n\t.long .LECIE2-.LSCIE2\n.LSCIE2:\n\t.long 0\n\t.byte 0x1\n\t.string \"zR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE2:\n\n"
               ,0xe3,1,(FILE *)ctx_.fp);
        pcVar13 = 
        ".LSFDE3:\n\t.long .LEFDE3-.LASFDE3\n.LASFDE3:\n\t.long .LASFDE3-.Lframe2\n\t.long lj_vm_ffi_call-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE3:\n\n"
        ;
        pBStack_a90 = (BuildCtx *)0x106d87;
        fprintf((FILE *)ctx_.fp,
                ".LSFDE3:\n\t.long .LEFDE3-.LASFDE3\n.LASFDE3:\n\t.long .LASFDE3-.Lframe2\n\t.long lj_vm_ffi_call-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE3:\n\n"
                ,(ulong)((int32_t)ctx_.codesz - uVar5));
      }
      break;
    case BUILD_peobj:
      pBStack_a90 = (BuildCtx *)0x107336;
      emit_peobj(&ctx_);
      break;
    case BUILD_raw:
      pBStack_a90 = (BuildCtx *)0x10732a;
      pcVar13 = (char *)ctx_.code;
      owrite(&ctx_,ctx_.code,CONCAT44(ctx_.codesz._4_4_,(int32_t)ctx_.codesz));
      break;
    case BUILD_bcdef:
      pBStack_a90 = (BuildCtx *)0x107263;
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx_.fp);
      pcVar13 = (char *)0x2a;
      pBStack_a90 = (BuildCtx *)0x10727e;
      fwrite("LJ_DATADEF const uint16_t lj_bc_ofs[] = {\n",0x2a,1,(FILE *)ctx_.fp);
      if (0 < ctx_.npc) {
        unaff_R14 = (char **)0x113b41;
        lVar14 = 0;
        do {
          if (lVar14 != 0) {
            pBStack_a90 = (BuildCtx *)0x1072b2;
            fwrite(",\n",2,1,(FILE *)ctx_.fp);
          }
          pcVar13 = "%d";
          pBStack_a90 = (BuildCtx *)0x1072ca;
          fprintf((FILE *)ctx_.fp,"%d",(ulong)(uint)ctx_.bc_ofs[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar14 < ctx_.npc);
      }
    case BUILD_ffdef:
    case BUILD_libdef:
    case BUILD_recdef:
      pBStack_a90 = (BuildCtx *)0x1072e1;
      emit_lib(&ctx_);
      break;
    case BUILD_vmdef:
      pBStack_a90 = (BuildCtx *)0x106efe;
      fwrite("-- This is a generated file. DO NOT EDIT!\n\n",0x2b,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x106f19;
      fwrite("return {\n\n",10,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x106f34;
      fwrite("bcnames = \"",0xb,1,(FILE *)ctx_.fp);
      lVar14 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x106f58;
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)bc_names + lVar14));
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x308);
      pBStack_a90 = (BuildCtx *)0x106f80;
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x106f9b;
      fwrite("irnames = \"",0xb,1,(FILE *)ctx_.fp);
      lVar14 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x106fbf;
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)ir_names + lVar14));
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x318);
      pBStack_a90 = (BuildCtx *)0x106fe7;
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x107002;
      fwrite("irfpm = { [0]=",0xe,1,(FILE *)ctx_.fp);
      lVar14 = 0;
      do {
        pcVar7 = irfpm_names[lVar14];
        cVar2 = *pcVar7;
        pcVar13 = buf;
        while (cVar2 != '\0') {
          pcVar7 = pcVar7 + 1;
          cVar12 = cVar2 + ' ';
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            cVar12 = cVar2;
          }
          *pcVar13 = cVar12;
          pcVar13 = pcVar13 + 1;
          cVar2 = *pcVar7;
        }
        *pcVar13 = '\0';
        pBStack_a90 = (BuildCtx *)0x107066;
        fprintf((FILE *)ctx_.fp,"\"%s\", ",buf);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 7);
      pBStack_a90 = (BuildCtx *)0x10708a;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x1070a5;
      fwrite("irfield = { [0]=",0x10,1,(FILE *)ctx_.fp);
      lVar14 = 0;
      do {
        pcVar7 = irfield_names[lVar14];
        cVar2 = *pcVar7;
        pcVar13 = buf;
        while (cVar2 != '\0') {
          pcVar7 = pcVar7 + 1;
          cVar12 = cVar2 + ' ';
          if (0x19 < (byte)(cVar2 + 0xbfU)) {
            cVar12 = cVar2;
          }
          *pcVar13 = cVar12;
          pcVar13 = pcVar13 + 1;
          cVar2 = *pcVar7;
        }
        *pcVar13 = '\0';
        pBStack_a90 = (BuildCtx *)0x107104;
        pcVar7 = strchr(buf,0x5f);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '.';
        }
        pBStack_a90 = (BuildCtx *)0x10711e;
        fprintf((FILE *)ctx_.fp,"\"%s\", ",buf);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x13);
      pBStack_a90 = (BuildCtx *)0x107142;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x10715d;
      fwrite("ircall = {\n[0]=",0xf,1,(FILE *)ctx_.fp);
      lVar14 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x107181;
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)ircall_names + lVar14));
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x340);
      pBStack_a90 = (BuildCtx *)0x1071a9;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x1071c4;
      fwrite("traceerr = {\n[0]=",0x11,1,(FILE *)ctx_.fp);
      unaff_R14 = trace_errors;
      lVar14 = 0;
      do {
        pBStack_a90 = (BuildCtx *)0x1071e8;
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)trace_errors + lVar14));
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x118);
      pBStack_a90 = (BuildCtx *)0x107214;
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      pBStack_a90 = (BuildCtx *)0x10721c;
      emit_lib(&ctx_);
      pcVar7 = "}\n\n";
      pcVar13 = (char *)0x3;
LAB_0010722c:
      pBStack_a90 = (BuildCtx *)0x107236;
      fwrite(pcVar7,(size_t)pcVar13,1,(FILE *)ctx_.fp);
      break;
    case BUILD_folddef:
      pBStack_a90 = (BuildCtx *)0x107245;
      emit_fold(&ctx_);
    }
    pBStack_a90 = (BuildCtx *)0x1072eb;
    fflush((FILE *)ctx_.fp);
    unaff_RBX = (char **)ctx_.fp;
    pBStack_a90 = (BuildCtx *)0x1072f8;
    iVar10 = ferror((FILE *)ctx_.fp);
    if (iVar10 == 0) {
      pBStack_a90 = (BuildCtx *)0x107304;
      fclose((FILE *)unaff_RBX);
      return 0;
    }
  }
  pBStack_a90 = (BuildCtx *)0x10734a;
  main_cold_2();
LAB_0010734a:
  iVar10 = (int)&ctx_ + 0x18;
  pBStack_a90 = (BuildCtx *)sym_decorate;
  main_cold_1();
  pcVar7 = "";
  if (iVar10 == 2) {
    pcVar7 = "_";
  }
  pFStack_a98 = (FILE *)unaff_RBX;
  pBStack_a90 = (BuildCtx *)unaff_R14;
  sprintf(acStack_ba0,"%s%s%s",pcVar7,pcVar13,extraout_RDX);
  pcVar7 = strchr(acStack_ba0,0x40);
  if (pcVar7 != (char *)0x0) {
    *pcVar7 = '\0';
  }
  sVar6 = strlen(acStack_ba0);
  pcVar7 = (char *)malloc(sVar6 + 1);
  strcpy(pcVar7,acStack_ba0);
  return (int)pcVar7;
}

Assistant:

int main(int argc, char **argv)
{
  BuildCtx ctx_;
  BuildCtx *ctx = &ctx_;
  int status, binmode;

  if (sizeof(void *) != 4*LJ_32+8*LJ_64) {
    fprintf(stderr,"Error: pointer size mismatch in cross-build.\n");
    fprintf(stderr,"Try: make HOST_CC=\"gcc -m32\" CROSS=...\n\n");
    return 1;
  }

  UNUSED(argc);
  parseargs(ctx, argv);

  if ((status = build_code(ctx))) {
    fprintf(stderr,"Error: DASM error %08x\n", status);
    return 1;
  }

  switch (ctx->mode) {
  case BUILD_peobj:
  case BUILD_raw:
    binmode = 1;
    break;
  default:
    binmode = 0;
    break;
  }

  if (ctx->outname[0] == '-' && ctx->outname[1] == '\0') {
    ctx->fp = stdout;
#if defined(_WIN32)
    if (binmode)
      _setmode(_fileno(stdout), _O_BINARY);  /* Yuck. */
#endif
  } else if (!(ctx->fp = fopen(ctx->outname, binmode ? "wb" : "w"))) {
    fprintf(stderr, "Error: cannot open output file '%s': %s\n",
	    ctx->outname, strerror(errno));
    exit(1);
  }

  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
  case BUILD_machasm:
    emit_asm(ctx);
    emit_asm_debug(ctx);
    break;
  case BUILD_peobj:
    emit_peobj(ctx);
    break;
  case BUILD_raw:
    emit_raw(ctx);
    break;
  case BUILD_bcdef:
    emit_bcdef(ctx);
    emit_lib(ctx);
    break;
  case BUILD_vmdef:
    emit_vmdef(ctx);
    emit_lib(ctx);
    fprintf(ctx->fp, "}\n\n");
    break;
  case BUILD_ffdef:
  case BUILD_libdef:
  case BUILD_recdef:
    emit_lib(ctx);
    break;
  case BUILD_folddef:
    emit_fold(ctx);
    break;
  default:
    break;
  }

  fflush(ctx->fp);
  if (ferror(ctx->fp)) {
    fprintf(stderr, "Error: cannot write to output file: %s\n",
	    strerror(errno));
    exit(1);
  }
  fclose(ctx->fp);

  return 0;
}